

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::NewKey
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,int key)

{
  Node *pNVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  Node *pNVar5;
  uint uVar6;
  Node *pNVar7;
  Node *pNVar8;
  
  while (uVar6 = this->Size - 1 & key, pNVar1 = this->Nodes + uVar6,
        this->Nodes[uVar6].Next != (Node *)0x1) {
    pNVar5 = GetFreePos(this);
    if (pNVar5 != (Node *)0x0) {
      pNVar8 = this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key);
      if (this->Nodes + (this->Size - 1 & (pNVar1->Pair).Key) != pNVar1) goto LAB_004e82e1;
      pNVar5->Next = pNVar1->Next;
      pNVar8 = pNVar5;
      goto LAB_004e8304;
    }
    Rehash(this);
  }
LAB_004e82ff:
  pNVar5 = (Node *)0x0;
  pNVar8 = pNVar1;
LAB_004e8304:
  pNVar1->Next = pNVar5;
  this->NumUsed = this->NumUsed + 1;
  (pNVar8->Pair).Key = key;
  return pNVar8;
LAB_004e82e1:
  do {
    pNVar7 = pNVar8;
    pNVar8 = pNVar7->Next;
  } while (pNVar8 != pNVar1);
  pNVar7->Next = pNVar5;
  pNVar8 = pNVar1->Next;
  iVar3 = (pNVar1->Pair).Key;
  uVar4 = *(undefined4 *)&(pNVar1->Pair).field_0x4;
  uVar6 = (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most;
  uVar2 = (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count;
  (pNVar5->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array =
       (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array;
  (pNVar5->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most = uVar6;
  (pNVar5->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count = uVar2;
  pNVar5->Next = pNVar8;
  (pNVar5->Pair).Key = iVar3;
  *(undefined4 *)&(pNVar5->Pair).field_0x4 = uVar4;
  goto LAB_004e82ff;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}